

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O0

PrefixData *
getPackagePrefixData
          (PrefixData *__return_storage_ptr__,File *file,Point cursorPosition,
          TSNode_conflict packageNode)

{
  File *file_local;
  Point cursorPosition_local;
  
  __return_storage_ptr__->type = None;
  Point::Point(&(__return_storage_ptr__->range).start);
  Point::Point(&(__return_storage_ptr__->range).end);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->value);
  return __return_storage_ptr__;
}

Assistant:

PrefixData getPackagePrefixData (File &file, Point cursorPosition, TSNode packageNode) {
    return {};
}